

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpSolver.cc
# Opt level: O2

void __thiscall Glucose::SimpSolver::~SimpSolver(SimpSolver *this)

{
  (this->super_Solver).super_Clone._vptr_Clone = (_func_int **)&PTR_clone_0011cd18;
  vec<char>::~vec(&this->eliminated);
  vec<char>::~vec(&this->frozen);
  vec<unsigned_int>::~vec(&(this->subsumption_queue).buf);
  Heap<Glucose::SimpSolver::ElimLt>::~Heap(&this->elim_heap);
  vec<int>::~vec(&this->n_occ);
  OccLists<int,_Glucose::vec<unsigned_int>,_Glucose::SimpSolver::ClauseDeleted>::~OccLists
            (&this->occurs);
  vec<char>::~vec(&this->touched);
  vec<unsigned_int>::~vec(&this->elimclauses);
  Solver::~Solver(&this->super_Solver);
  return;
}

Assistant:

SimpSolver::~SimpSolver()
{
}